

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
::
emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,phmap::priv::hash_internal::EnumClass_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
          *this,EnumClass *key,size_t hashval,EnumClass *args)

{
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *this_00;
  size_t sVar1;
  size_t sVar2;
  ctrl_t *pcVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
             *)(this + (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                               (uint)hashval >> 0x10 ^ (uint)(hashval >> 8) & 0xffffff) & 0xf) *
                       0x48);
  sVar1 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
          ::_find_key<phmap::priv::hash_internal::EnumClass>(this_00,key,hashval);
  if (sVar1 == 0xffffffffffffffff) {
    sVar2 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
            ::prepare_insert(this_00,hashval);
    this_00->slots_[sVar2] = *args;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
    ::set_ctrl(this_00,sVar2,(byte)hashval & 0x7f);
    pcVar3 = this_00->ctrl_;
    pcVar4 = pcVar3 + sVar2;
    psVar5 = this_00->slots_ + sVar2;
  }
  else {
    pcVar3 = this_00->ctrl_;
    pcVar4 = pcVar3 + sVar1;
    psVar5 = this_00->slots_ + sVar1;
  }
  sVar2 = this_00->capacity_;
  (__return_storage_ptr__->first).inner_ = (Inner *)this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x480);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar4;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar5;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar3 + sVar2;
  __return_storage_ptr__->second = sVar1 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }